

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace_diag_avx2_256_64.c
# Opt level: O0

parasail_result_t *
parasail_sw_trace_diag_avx2_256_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  __m256i vWH_00;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined8 uVar39;
  undefined1 auVar40 [24];
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  long lVar78;
  long lVar79;
  int64_t iVar80;
  long lVar81;
  long lVar82;
  int64_t iVar83;
  long lVar84;
  int8_t *array;
  long lVar85;
  int64_t iVar86;
  int in_ECX;
  long lVar87;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 uVar88;
  undefined8 uVar89;
  ulong uVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined8 uVar100;
  undefined8 uVar101;
  undefined1 auVar98 [16];
  long lVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  long lVar105;
  undefined1 auVar99 [32];
  undefined8 uVar106;
  undefined8 uVar107;
  long lVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  long in_stack_00000008;
  int32_t k;
  int64_t *j_1;
  int64_t *i_1;
  int64_t *t;
  __m256i cond_Jlt;
  __m256i cond_all;
  __m256i cond_max;
  __m256i cond_eq;
  __m256i cond_valid_IJ;
  __m256i cond_valid_J;
  __m256i vFT;
  __m256i vET;
  __m256i condF;
  __m256i condE;
  __m256i vT;
  __m256i case2;
  __m256i case1;
  __m256i cond_zero;
  __m256i cond;
  __m256i vNWH;
  __m256i vMat;
  __m256i vIltLimit;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m256i vJ;
  __m256i vF_ext;
  __m256i vF_opn;
  __m256i vF;
  __m256i vE_ext;
  __m256i vE_opn;
  __m256i vE;
  __m256i vWH;
  __m256i vNH;
  __m256i vTDelF;
  __m256i vTDiagF;
  __m256i vTInsE;
  __m256i vTDiagE;
  __m256i vTZero;
  __m256i vTDel;
  __m256i vTIns;
  __m256i vTDiag;
  __m256i vJLimit;
  __m256i vILimit;
  __m256i vEndJ;
  __m256i vEndI;
  __m256i vMaxH;
  __m256i vJreset;
  __m256i vI;
  __m256i vNegOne;
  __m256i vN;
  __m256i vOne;
  __m256i vZero;
  __m256i vGap;
  __m256i vOpen;
  __m256i vNegInf0;
  __m256i vNegInf;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int64_t score;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int64_t *F_pr;
  int64_t *H_pr;
  int64_t *s2;
  int64_t *_F_pr;
  int64_t *_H_pr;
  int64_t *s2B;
  int64_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int32_t in_stack_ffffffffffffe468;
  int32_t in_stack_ffffffffffffe46c;
  int32_t in_stack_ffffffffffffe470;
  int32_t in_stack_ffffffffffffe474;
  undefined4 in_stack_ffffffffffffe478;
  int in_stack_ffffffffffffe47c;
  long lVar133;
  int local_1b64;
  undefined4 in_stack_ffffffffffffe4b8;
  int in_stack_ffffffffffffe4bc;
  long lVar134;
  undefined4 in_stack_ffffffffffffe4d8;
  int in_stack_ffffffffffffe4dc;
  int local_1b00;
  int local_1afc;
  long *local_1af8;
  long *local_1af0;
  ulong *local_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  ulong local_1900;
  long lStack_18f8;
  long lStack_18f0;
  long lStack_18e8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined1 local_1880 [32];
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined1 local_1820 [24];
  long lStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined1 local_17c0 [32];
  undefined1 local_17a0 [24];
  long lStack_1788;
  undefined1 local_1780 [32];
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined1 local_15a0 [32];
  long local_1580;
  long lStack_1578;
  long lStack_1570;
  long lStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  ulong local_1520;
  long lStack_1518;
  long lStack_1510;
  long lStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined1 local_14c0 [32];
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  ulong local_13e8;
  ulong local_13e0;
  ulong local_13d8;
  int local_13cc;
  int local_13c8;
  int local_13c4;
  int local_13c0;
  int local_13bc;
  parasail_result_t *local_13b8;
  int64_t *local_13b0;
  int64_t *local_13a8;
  int64_t *local_13a0;
  int64_t *local_1398;
  int64_t *local_1390;
  int64_t *local_1388;
  int64_t *local_1380;
  int local_1378;
  int local_1374;
  int local_1370;
  int local_136c;
  int local_1368;
  int local_135c;
  long local_1358;
  long local_1348;
  parasail_result_t *local_1340;
  undefined8 local_1338;
  undefined8 local_1330;
  undefined8 local_1328;
  undefined8 local_1320;
  undefined8 local_1318;
  undefined8 local_1310;
  undefined8 local_1308;
  undefined8 local_1300;
  ulong local_12f8;
  ulong local_12f0;
  undefined8 local_12e8;
  undefined8 local_12e0;
  undefined8 local_12d8;
  undefined8 local_12d0;
  ulong local_12c8;
  ulong local_12c0;
  ulong local_12b8;
  ulong local_12b0;
  ulong local_12a8;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [16];
  undefined1 auStack_1110 [16];
  ulong local_1100;
  ulong local_10f8;
  ulong local_10f0;
  ulong local_10e8;
  undefined1 local_10e0 [16];
  undefined1 auStack_10d0 [16];
  ulong local_10c0;
  ulong local_10b8;
  ulong local_10b0;
  ulong local_10a8;
  undefined1 local_10a0 [16];
  undefined1 auStack_1090 [16];
  ulong local_1080;
  ulong local_1078;
  ulong local_1070;
  ulong local_1068;
  undefined1 local_1060 [16];
  undefined1 auStack_1050 [16];
  ulong local_1040;
  ulong local_1038;
  ulong local_1030;
  ulong local_1028;
  undefined1 local_1020 [16];
  undefined1 auStack_1010 [16];
  ulong local_1000;
  ulong local_ff8;
  ulong local_ff0;
  ulong local_fe8;
  undefined1 local_fe0 [16];
  undefined1 auStack_fd0 [16];
  undefined8 local_fc0;
  undefined8 local_fb8;
  undefined8 local_fb0;
  undefined8 local_fa8;
  undefined1 local_fa0 [16];
  undefined1 auStack_f90 [16];
  undefined8 local_f80;
  undefined8 local_f78;
  undefined8 local_f70;
  undefined8 local_f68;
  undefined1 local_f60 [16];
  undefined1 auStack_f50 [16];
  undefined8 local_f40;
  undefined8 local_f38;
  undefined8 local_f30;
  undefined8 local_f28;
  undefined1 local_f20 [16];
  undefined1 auStack_f10 [16];
  undefined8 local_f00;
  undefined8 local_ef8;
  undefined8 local_ef0;
  undefined8 local_ee8;
  undefined1 local_ee0 [16];
  undefined1 auStack_ed0 [16];
  ulong local_ec0;
  ulong local_eb8;
  ulong local_eb0;
  ulong local_ea8;
  undefined1 local_ea0 [16];
  undefined1 auStack_e90 [16];
  ulong local_e80;
  ulong local_e78;
  ulong local_e70;
  ulong local_e68;
  undefined1 local_e60 [16];
  undefined1 auStack_e50 [16];
  undefined8 local_e40;
  undefined8 local_e38;
  undefined8 local_e30;
  undefined8 local_e28;
  undefined1 local_e20 [16];
  undefined1 auStack_e10 [16];
  undefined8 local_e00;
  undefined8 local_df8;
  undefined8 local_df0;
  undefined8 local_de8;
  undefined1 local_de0 [16];
  undefined1 auStack_dd0 [16];
  undefined8 local_dc0;
  undefined8 local_db8;
  undefined8 local_db0;
  undefined8 local_da8;
  undefined1 local_da0 [16];
  undefined1 auStack_d90 [16];
  undefined8 local_d80;
  undefined8 local_d78;
  undefined8 local_d70;
  undefined8 local_d68;
  undefined1 local_d60 [16];
  undefined1 auStack_d50 [16];
  undefined8 local_d40;
  undefined8 local_d38;
  undefined8 local_d30;
  undefined8 local_d28;
  undefined1 local_d20 [16];
  undefined1 auStack_d10 [16];
  undefined8 local_d00;
  undefined8 local_cf8;
  undefined8 local_cf0;
  undefined8 local_ce8;
  undefined1 local_ce0 [16];
  undefined1 auStack_cd0 [16];
  undefined8 local_cc0;
  undefined8 local_cb8;
  undefined8 local_cb0;
  undefined8 local_ca8;
  undefined1 local_ca0 [32];
  undefined8 local_c80;
  undefined8 local_c78;
  undefined8 local_c70;
  undefined8 local_c68;
  undefined1 local_c60 [16];
  undefined1 auStack_c50 [16];
  ulong local_c40;
  ulong local_c38;
  ulong local_c30;
  ulong local_c28;
  undefined1 local_c20 [16];
  undefined1 auStack_c10 [16];
  undefined8 local_c00;
  undefined8 local_bf8;
  undefined8 local_bf0;
  undefined8 local_be8;
  undefined1 local_be0 [16];
  undefined1 auStack_bd0 [16];
  undefined8 local_bc0;
  undefined8 local_bb8;
  undefined8 local_bb0;
  undefined8 local_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  long local_b20;
  long lStack_b18;
  long lStack_b10;
  long lStack_b08;
  long local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  ulong local_ae0;
  long lStack_ad8;
  long lStack_ad0;
  long lStack_ac8;
  ulong local_ac0;
  long lStack_ab8;
  long lStack_ab0;
  long lStack_aa8;
  long local_aa0;
  long lStack_a98;
  long lStack_a90;
  long lStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  long local_a60;
  long lStack_a58;
  long lStack_a50;
  long lStack_a48;
  long local_a40;
  long lStack_a38;
  long lStack_a30;
  long lStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  int64_t iStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  int64_t iStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  long local_800;
  long lStack_7f8;
  long lStack_7f0;
  long lStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  ulong local_7a0;
  long lStack_798;
  long lStack_790;
  long lStack_788;
  ulong local_780;
  long lStack_778;
  long lStack_770;
  long lStack_768;
  ulong local_760;
  long lStack_758;
  long lStack_750;
  long lStack_748;
  ulong local_740;
  long lStack_738;
  long lStack_730;
  long lStack_728;
  ulong local_720;
  long lStack_718;
  long lStack_710;
  long lStack_708;
  ulong local_700;
  long lStack_6f8;
  long lStack_6f0;
  long lStack_6e8;
  ulong local_6e0;
  long lStack_6d8;
  long lStack_6d0;
  long lStack_6c8;
  ulong local_6c0;
  long lStack_6b8;
  long lStack_6b0;
  long lStack_6a8;
  long local_6a0;
  long lStack_698;
  long lStack_690;
  long lStack_688;
  long local_680;
  long lStack_678;
  long lStack_670;
  long lStack_668;
  ulong local_660;
  long lStack_658;
  long lStack_650;
  long lStack_648;
  undefined1 local_640 [32];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  long local_600;
  long lStack_5f8;
  long lStack_5f0;
  long lStack_5e8;
  long local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  long local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  long local_540;
  long lStack_538;
  long lStack_530;
  long lStack_528;
  long local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  long local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  ulong local_480;
  long lStack_478;
  long lStack_470;
  long lStack_468;
  ulong local_460;
  long lStack_458;
  long lStack_450;
  long lStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  undefined1 auStack_3f0 [16];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  long local_380;
  long lStack_378;
  long lStack_370;
  long lStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  long local_320;
  long lStack_318;
  long lStack_310;
  long lStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  long local_2c0;
  long lStack_2b8;
  long lStack_2b0;
  long lStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  long local_260;
  long lStack_258;
  long lStack_250;
  long lStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  long local_200;
  long lStack_1f8;
  long lStack_1f0;
  long lStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  long local_160;
  long lStack_158;
  long lStack_150;
  long lStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  local_1368 = 0;
  local_136c = 0;
  local_1370 = 0;
  local_1374 = 0;
  local_1378 = 0;
  local_1380 = (int64_t *)0x0;
  local_1388 = (int64_t *)0x0;
  local_1390 = (int64_t *)0x0;
  local_1398 = (int64_t *)0x0;
  local_13a0 = (int64_t *)0x0;
  local_13a8 = (int64_t *)0x0;
  local_13b0 = (int64_t *)0x0;
  local_13b8 = (parasail_result_t *)0x0;
  local_13bc = 0;
  local_13c0 = 0;
  local_13c4 = 0;
  local_13c8 = 0;
  local_13cc = 0;
  local_13d8 = 0;
  local_13e0 = 0;
  local_13e8 = 0;
  if (in_RDX == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_trace_diag_avx2_256_64","_s2");
    local_1340 = (parasail_result_t *)0x0;
  }
  else if (in_ECX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_trace_diag_avx2_256_64","s2Len");
    local_1340 = (parasail_result_t *)0x0;
  }
  else if (in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_trace_diag_avx2_256_64","open");
    local_1340 = (parasail_result_t *)0x0;
  }
  else if (in_R9D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_trace_diag_avx2_256_64","gap");
    local_1340 = (parasail_result_t *)0x0;
  }
  else if (in_stack_00000008 == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_trace_diag_avx2_256_64","matrix");
    local_1340 = (parasail_result_t *)0x0;
  }
  else {
    if (*(int *)(in_stack_00000008 + 0x30) == 0) {
      if (in_RDI == 0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sw_trace_diag_avx2_256_64","_s1");
        return (parasail_result_t *)0x0;
      }
      if (in_ESI < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_trace_diag_avx2_256_64","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_1368 = 4;
    local_136c = 3;
    local_1370 = 6;
    local_1b00 = in_ESI;
    if (*(int *)(in_stack_00000008 + 0x30) != 0) {
      local_1b00 = *(int *)(in_stack_00000008 + 0x34);
    }
    local_13c4 = local_1b00;
    local_1374 = local_1b00 + 3;
    local_1378 = in_ECX + 3;
    local_13bc = 0;
    local_13c0 = 0;
    local_13c8 = 0;
    local_13cc = 0;
    if (-in_R8D < *(int *)(in_stack_00000008 + 0x20)) {
      lVar78 = (long)in_R8D;
    }
    else {
      lVar78 = -(long)*(int *)(in_stack_00000008 + 0x20);
    }
    local_13e8 = lVar78 + 0x8000000000000001;
    local_13e0 = 0x7ffffffffffffffe - (long)*(int *)(in_stack_00000008 + 0x1c);
    auVar91._8_8_ = 0;
    auVar91._0_8_ = local_13e8;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = local_13e8;
    local_1120 = vpunpcklqdq_avx(auVar91,auVar109);
    auVar110._8_8_ = 0;
    auVar110._0_8_ = local_13e8;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = local_13e8;
    auStack_1110 = vpunpcklqdq_avx(auVar110,auVar125);
    local_1420 = local_1120._0_8_;
    uStack_1418 = local_1120._8_8_;
    uStack_1410 = auStack_1110._0_8_;
    uStack_1408 = auStack_1110._8_8_;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = local_13e0;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = local_13e0;
    local_10e0 = vpunpcklqdq_avx(auVar92,auVar111);
    auVar112._8_8_ = 0;
    auVar112._0_8_ = local_13e0;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = local_13e0;
    auStack_10d0 = vpunpcklqdq_avx(auVar112,auVar126);
    local_1440 = local_10e0._0_8_;
    uStack_1438 = local_10e0._8_8_;
    uStack_1430 = auStack_10d0._0_8_;
    uStack_1428 = auStack_10d0._8_8_;
    local_1460 = local_10e0._0_8_;
    uStack_1458 = local_10e0._8_8_;
    uStack_1450 = auStack_10d0._0_8_;
    uStack_1448 = auStack_10d0._8_8_;
    local_1480 = local_1120._0_8_;
    uStack_1478 = local_1120._8_8_;
    uStack_1470 = auStack_1110._0_8_;
    uStack_1468 = auStack_1110._8_8_;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = local_13e8;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = local_13e8;
    local_10a0 = vpunpcklqdq_avx(auVar93,auVar113);
    auVar114._8_8_ = 0;
    auVar114._0_8_ = local_13e8;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = local_13e8;
    auStack_1090 = vpunpcklqdq_avx(auVar114,auVar127);
    local_14a0 = local_10a0._0_8_;
    uStack_1498 = local_10a0._8_8_;
    uStack_1490 = auStack_1090._0_8_;
    uStack_1488 = auStack_1090._8_8_;
    auVar4._16_8_ = auStack_1090._0_8_;
    auVar4._0_16_ = local_10a0;
    auVar4._24_8_ = auStack_1090._8_8_;
    local_1140 = vpslldq_avx2(ZEXT1632(auStack_1090),8);
    local_1160 = vpsrldq_avx2(auVar4,8);
    local_14c0 = vpor_avx2(local_1140,local_1160);
    local_12c0 = (ulong)in_R8D;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = local_12c0;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = local_12c0;
    local_1060 = vpunpcklqdq_avx(auVar94,auVar115);
    auVar116._8_8_ = 0;
    auVar116._0_8_ = local_12c0;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = local_12c0;
    auStack_1050 = vpunpcklqdq_avx(auVar116,auVar128);
    local_14e0 = local_1060._0_8_;
    uStack_14d8 = local_1060._8_8_;
    uStack_14d0 = auStack_1050._0_8_;
    uStack_14c8 = auStack_1050._8_8_;
    local_12c8 = (ulong)in_R9D;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = local_12c8;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = local_12c8;
    local_1020 = vpunpcklqdq_avx(auVar95,auVar117);
    auVar118._8_8_ = 0;
    auVar118._0_8_ = local_12c8;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = local_12c8;
    auStack_1010 = vpunpcklqdq_avx(auVar118,auVar129);
    local_1500 = local_1020._0_8_;
    uStack_14f8 = local_1020._8_8_;
    uStack_14f0 = auStack_1010._0_8_;
    uStack_14e8 = auStack_1010._8_8_;
    local_12d0 = 0;
    local_fa8 = 0;
    local_fb0 = 0;
    local_fb8 = 0;
    local_fc0 = 0;
    local_fe0 = vpunpcklqdq_avx(ZEXT816(0),ZEXT816(0));
    auStack_fd0 = vpunpcklqdq_avx(ZEXT816(0),ZEXT816(0));
    local_1520 = local_fe0._0_8_;
    lStack_1518 = local_fe0._8_8_;
    lStack_1510 = auStack_fd0._0_8_;
    lStack_1508 = auStack_fd0._8_8_;
    local_12d8 = 1;
    local_f68 = 1;
    local_f70 = 1;
    local_f78 = 1;
    local_f80 = 1;
    local_fa0 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    auStack_f90 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    local_1540 = local_fa0._0_8_;
    uStack_1538 = local_fa0._8_8_;
    uStack_1530 = auStack_f90._0_8_;
    uStack_1528 = auStack_f90._8_8_;
    local_12e0 = 4;
    local_f60 = vpunpcklqdq_avx(ZEXT816(4),ZEXT816(4));
    auStack_f50 = vpunpcklqdq_avx(ZEXT816(4),ZEXT816(4));
    local_1560 = local_f60._0_8_;
    uStack_1558 = local_f60._8_8_;
    uStack_1550 = auStack_f50._0_8_;
    uStack_1548 = auStack_f50._8_8_;
    local_12e8 = 0xffffffffffffffff;
    local_ee8 = 0xffffffffffffffff;
    local_ef0 = 0xffffffffffffffff;
    local_ef8 = 0xffffffffffffffff;
    local_f00 = 0xffffffffffffffff;
    local_f20 = vpunpcklqdq_avx(ZEXT816(0xffffffffffffffff),ZEXT816(0xffffffffffffffff));
    auStack_f10 = vpunpcklqdq_avx(ZEXT816(0xffffffffffffffff),ZEXT816(0xffffffffffffffff));
    local_1580 = local_f20._0_8_;
    lStack_1578 = local_f20._8_8_;
    lStack_1570 = auStack_f10._0_8_;
    lStack_1568 = auStack_f10._8_8_;
    local_ba8 = 0;
    local_bb0 = 1;
    local_bb8 = 2;
    local_bc0 = 3;
    local_be0 = vpunpcklqdq_avx(ZEXT816(3),ZEXT816(2));
    auStack_bd0 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(0));
    local_15a0._16_8_ = auStack_bd0._0_8_;
    local_15a0._0_16_ = local_be0;
    local_15a0._24_8_ = auStack_bd0._8_8_;
    local_be8 = 0;
    local_bf0 = 0xffffffffffffffff;
    local_bf8 = 0xfffffffffffffffe;
    local_c00 = 0xfffffffffffffffd;
    local_c20 = vpunpcklqdq_avx(ZEXT816(0xfffffffffffffffd),ZEXT816(0xfffffffffffffffe));
    auStack_c10 = vpunpcklqdq_avx(ZEXT816(0xffffffffffffffff),ZEXT816(0));
    local_15c0 = local_c20._0_8_;
    uStack_15b8 = local_c20._8_8_;
    uStack_15b0 = auStack_c10._0_8_;
    uStack_15a8 = auStack_c10._8_8_;
    local_15e0._16_8_ = auStack_1090._0_8_;
    local_15e0._0_16_ = local_10a0;
    local_15e0._24_8_ = auStack_1090._8_8_;
    local_1600._16_8_ = auStack_1090._0_8_;
    local_1600._0_16_ = local_10a0;
    local_1600._24_8_ = auStack_1090._8_8_;
    local_1620._16_8_ = auStack_1090._0_8_;
    local_1620._0_16_ = local_10a0;
    local_1620._24_8_ = auStack_1090._8_8_;
    local_12f0 = (ulong)local_1b00;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = local_12f0;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = local_12f0;
    auVar91 = vpunpcklqdq_avx(auVar96,auVar119);
    auVar120._8_8_ = 0;
    auVar120._0_8_ = local_12f0;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = local_12f0;
    auStack_ed0 = vpunpcklqdq_avx(auVar120,auVar130);
    local_ee0._0_8_ = auVar91._0_8_;
    uVar42 = local_ee0._0_8_;
    local_ee0._8_8_ = auVar91._8_8_;
    uVar43 = local_ee0._8_8_;
    uVar44 = auStack_ed0._0_8_;
    uVar45 = auStack_ed0._8_8_;
    local_12f8 = (ulong)in_ECX;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = local_12f8;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = local_12f8;
    auVar92 = vpunpcklqdq_avx(auVar97,auVar121);
    auVar122._8_8_ = 0;
    auVar122._0_8_ = local_12f8;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = local_12f8;
    auStack_e90 = vpunpcklqdq_avx(auVar122,auVar131);
    local_ea0._0_8_ = auVar92._0_8_;
    uVar46 = local_ea0._0_8_;
    local_ea0._8_8_ = auVar92._8_8_;
    uVar47 = local_ea0._8_8_;
    uVar48 = auStack_e90._0_8_;
    uVar49 = auStack_e90._8_8_;
    local_1300 = 4;
    local_e28 = 4;
    local_e30 = 4;
    local_e38 = 4;
    local_e40 = 4;
    auVar93 = vpunpcklqdq_avx(ZEXT816(4),ZEXT816(4));
    auStack_e50 = vpunpcklqdq_avx(ZEXT816(4),ZEXT816(4));
    local_e60._0_8_ = auVar93._0_8_;
    uVar50 = local_e60._0_8_;
    local_e60._8_8_ = auVar93._8_8_;
    uVar51 = local_e60._8_8_;
    uVar52 = auStack_e50._0_8_;
    uVar53 = auStack_e50._8_8_;
    local_1308 = 1;
    local_de8 = 1;
    local_df0 = 1;
    local_df8 = 1;
    local_e00 = 1;
    auVar94 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    auStack_e10 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    local_e20._0_8_ = auVar94._0_8_;
    uVar54 = local_e20._0_8_;
    local_e20._8_8_ = auVar94._8_8_;
    uVar55 = local_e20._8_8_;
    uVar56 = auStack_e10._0_8_;
    uVar57 = auStack_e10._8_8_;
    local_1310 = 2;
    local_da8 = 2;
    local_db0 = 2;
    local_db8 = 2;
    local_dc0 = 2;
    auVar95 = vpunpcklqdq_avx(ZEXT816(2),ZEXT816(2));
    auStack_dd0 = vpunpcklqdq_avx(ZEXT816(2),ZEXT816(2));
    local_de0._0_8_ = auVar95._0_8_;
    uVar58 = local_de0._0_8_;
    local_de0._8_8_ = auVar95._8_8_;
    uVar59 = local_de0._8_8_;
    uVar60 = auStack_dd0._0_8_;
    uVar61 = auStack_dd0._8_8_;
    local_1318 = 0;
    local_d68 = 0;
    local_d70 = 0;
    local_d78 = 0;
    local_d80 = 0;
    auVar96 = vpunpcklqdq_avx(ZEXT816(0),ZEXT816(0));
    auStack_d90 = vpunpcklqdq_avx(ZEXT816(0),ZEXT816(0));
    local_da0._0_8_ = auVar96._0_8_;
    uVar62 = local_da0._0_8_;
    local_da0._8_8_ = auVar96._8_8_;
    uVar63 = local_da0._8_8_;
    uVar64 = auStack_d90._0_8_;
    uVar65 = auStack_d90._8_8_;
    local_1320 = 8;
    local_d28 = 8;
    local_d30 = 8;
    local_d38 = 8;
    local_d40 = 8;
    auVar97 = vpunpcklqdq_avx(ZEXT816(8),ZEXT816(8));
    auStack_d50 = vpunpcklqdq_avx(ZEXT816(8),ZEXT816(8));
    local_d60._0_8_ = auVar97._0_8_;
    uVar66 = local_d60._0_8_;
    local_d60._8_8_ = auVar97._8_8_;
    uVar67 = local_d60._8_8_;
    uVar68 = auStack_d50._0_8_;
    uVar69 = auStack_d50._8_8_;
    local_1328 = 0x10;
    local_ce8 = 0x10;
    local_cf0 = 0x10;
    local_cf8 = 0x10;
    local_d00 = 0x10;
    auVar109 = vpunpcklqdq_avx(ZEXT816(0x10),ZEXT816(0x10));
    auStack_d10 = vpunpcklqdq_avx(ZEXT816(0x10),ZEXT816(0x10));
    local_d20._0_8_ = auVar109._0_8_;
    uVar70 = local_d20._0_8_;
    local_d20._8_8_ = auVar109._8_8_;
    uVar71 = local_d20._8_8_;
    uVar72 = auStack_d10._0_8_;
    uVar73 = auStack_d10._8_8_;
    local_1330 = 0x20;
    local_ca8 = 0x20;
    local_cb0 = 0x20;
    local_cb8 = 0x20;
    local_cc0 = 0x20;
    auVar110 = vpunpcklqdq_avx(ZEXT816(0x20),ZEXT816(0x20));
    auStack_cd0 = vpunpcklqdq_avx(ZEXT816(0x20),ZEXT816(0x20));
    local_ce0._0_8_ = auVar110._0_8_;
    uVar74 = local_ce0._0_8_;
    local_ce0._8_8_ = auVar110._8_8_;
    uVar75 = local_ce0._8_8_;
    uVar76 = auStack_cd0._0_8_;
    uVar77 = auStack_cd0._8_8_;
    local_1338 = 0x40;
    local_c68 = 0x40;
    local_c70 = 0x40;
    local_c78 = 0x40;
    local_c80 = 0x40;
    auVar111 = vpunpcklqdq_avx(ZEXT816(0x40),ZEXT816(0x40));
    auVar112 = vpunpcklqdq_avx(ZEXT816(0x40),ZEXT816(0x40));
    auVar99._0_16_ = ZEXT116(0) * auVar111 + ZEXT116(1) * auVar112;
    auVar99._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar111;
    local_13d8 = local_13e8;
    local_135c = in_ECX;
    local_1358 = in_RDX;
    local_1348 = in_RDI;
    local_12b8 = local_13e8;
    local_12b0 = local_13e0;
    local_12a8 = local_13e8;
    local_1100 = local_13e8;
    local_10f8 = local_13e8;
    local_10f0 = local_13e8;
    local_10e8 = local_13e8;
    local_10c0 = local_13e0;
    local_10b8 = local_13e0;
    local_10b0 = local_13e0;
    local_10a8 = local_13e0;
    local_1080 = local_13e8;
    local_1078 = local_13e8;
    local_1070 = local_13e8;
    local_1068 = local_13e8;
    local_1040 = local_12c0;
    local_1038 = local_12c0;
    local_1030 = local_12c0;
    local_1028 = local_12c0;
    local_1000 = local_12c8;
    local_ff8 = local_12c8;
    local_ff0 = local_12c8;
    local_fe8 = local_12c8;
    local_f40 = local_12e0;
    local_f38 = local_12e0;
    local_f30 = local_12e0;
    local_f28 = local_12e0;
    local_ee0 = auVar91;
    local_ec0 = local_12f0;
    local_eb8 = local_12f0;
    local_eb0 = local_12f0;
    local_ea8 = local_12f0;
    local_ea0 = auVar92;
    local_e80 = local_12f8;
    local_e78 = local_12f8;
    local_e70 = local_12f8;
    local_e68 = local_12f8;
    local_e60 = auVar93;
    local_e20 = auVar94;
    local_de0 = auVar95;
    local_da0 = auVar96;
    local_d60 = auVar97;
    local_d20 = auVar109;
    local_ce0 = auVar110;
    local_ca0 = auVar99;
    local_13b8 = parasail_result_new_trace(local_1b00,in_ECX,0x20,1);
    if (local_13b8 == (parasail_result_t *)0x0) {
      local_1340 = (parasail_result_t *)0x0;
    }
    else {
      local_13b8->flag = local_13b8->flag | 0x4881004;
      local_1388 = parasail_memalign_int64_t(0x20,(long)(local_135c + local_1370));
      local_1390 = parasail_memalign_int64_t(0x20,(long)(local_135c + local_1370));
      local_1398 = parasail_memalign_int64_t(0x20,(long)(local_135c + local_1370));
      local_13a0 = local_1388 + local_136c;
      local_13a8 = local_1390 + local_136c;
      local_13b0 = local_1398 + local_136c;
      if (local_1388 == (int64_t *)0x0) {
        local_1340 = (parasail_result_t *)0x0;
      }
      else if (local_1390 == (int64_t *)0x0) {
        local_1340 = (parasail_result_t *)0x0;
      }
      else if (local_1398 == (int64_t *)0x0) {
        local_1340 = (parasail_result_t *)0x0;
      }
      else {
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          local_1380 = parasail_memalign_int64_t(0x20,(long)(local_13c4 + local_136c));
          if (local_1380 == (int64_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (local_13bc = 0; local_13bc < local_13c4; local_13bc = local_13bc + 1) {
            local_1380[local_13bc] =
                 (long)*(int *)(*(long *)(in_stack_00000008 + 0x10) +
                               (ulong)*(byte *)(local_1348 + local_13bc) * 4);
          }
          for (local_13bc = local_13c4; local_13bc < local_1374; local_13bc = local_13bc + 1) {
            local_1380[local_13bc] = 0;
          }
        }
        for (local_13c0 = 0; local_13c0 < local_135c; local_13c0 = local_13c0 + 1) {
          local_13a0[local_13c0] =
               (long)*(int *)(*(long *)(in_stack_00000008 + 0x10) +
                             (ulong)*(byte *)(local_1358 + local_13c0) * 4);
        }
        for (local_13c0 = -local_136c; local_13c0 < 0; local_13c0 = local_13c0 + 1) {
          local_13a0[local_13c0] = 0;
        }
        for (local_13c0 = local_135c; local_13c0 < local_1378; local_13c0 = local_13c0 + 1) {
          local_13a0[local_13c0] = 0;
        }
        for (local_13c0 = 0; local_13c0 < local_135c; local_13c0 = local_13c0 + 1) {
          local_13a8[local_13c0] = 0;
          local_13b0[local_13c0] = local_13d8;
        }
        for (local_13c0 = -local_136c; local_13c0 < 0; local_13c0 = local_13c0 + 1) {
          local_13a8[local_13c0] = local_13d8;
          local_13b0[local_13c0] = local_13d8;
        }
        for (local_13c0 = local_135c; local_13c0 < local_135c + local_136c;
            local_13c0 = local_13c0 + 1) {
          local_13a8[local_13c0] = local_13d8;
          local_13b0[local_13c0] = local_13d8;
        }
        for (local_13bc = 0; local_13bc < local_13c4; local_13bc = local_1368 + local_13bc) {
          local_1780 = local_14c0;
          _local_17a0 = local_14c0;
          local_17c0._8_8_ = uStack_1498;
          local_17c0._0_8_ = local_14a0;
          local_17c0._16_8_ = uStack_1490;
          local_17c0._24_8_ = uStack_1488;
          local_1820._8_8_ = uStack_1498;
          local_1820._0_8_ = local_14a0;
          local_1820._16_8_ = uStack_1490;
          lStack_1808 = uStack_1488;
          local_1880._8_8_ = uStack_15b8;
          local_1880._0_8_ = local_15c0;
          local_1880._16_8_ = uStack_15b0;
          local_1880._24_8_ = uStack_15a8;
          lVar78 = *(long *)(in_stack_00000008 + 8);
          lVar79 = (long)*(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            iVar80 = local_1380[local_13bc];
          }
          else {
            in_stack_ffffffffffffe4dc = local_13bc;
            if (local_13c4 <= local_13bc) {
              in_stack_ffffffffffffe4dc = local_13c4 + -1;
            }
            iVar80 = (int64_t)in_stack_ffffffffffffe4dc;
          }
          lVar81 = lVar78 + lVar79 * iVar80 * 4;
          lVar134 = *(long *)(in_stack_00000008 + 8);
          lVar82 = (long)*(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            iVar83 = local_1380[local_13bc + 1];
          }
          else {
            if (local_13bc + 1 < local_13c4) {
              in_stack_ffffffffffffe4bc = local_13bc + 1;
            }
            else {
              in_stack_ffffffffffffe4bc = local_13c4 + -1;
            }
            iVar83 = (int64_t)in_stack_ffffffffffffe4bc;
          }
          lVar84 = lVar134 + lVar82 * iVar83 * 4;
          lVar2 = *(long *)(in_stack_00000008 + 8);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            array = (int8_t *)local_1380[local_13bc + 2];
          }
          else {
            if (local_13bc + 2 < local_13c4) {
              local_1b64 = local_13bc + 2;
            }
            else {
              local_1b64 = local_13c4 + -1;
            }
            array = (int8_t *)(long)local_1b64;
          }
          lVar87 = (long)*(int *)(in_stack_00000008 + 0x18) * (long)array;
          lVar133 = *(long *)(in_stack_00000008 + 8);
          lVar85 = (long)*(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            iVar86 = local_1380[local_13bc + 3];
          }
          else {
            if (local_13bc + 3 < local_13c4) {
              in_stack_ffffffffffffe47c = local_13bc + 3;
            }
            else {
              in_stack_ffffffffffffe47c = local_13c4 + -1;
            }
            iVar86 = (int64_t)in_stack_ffffffffffffe47c;
          }
          lVar1 = lVar133 + lVar85 * iVar86 * 4;
          local_980 = uVar42;
          uStack_978 = uVar43;
          uStack_970 = uVar44;
          uStack_968 = uVar45;
          local_9a0 = local_15a0._0_8_;
          uStack_998 = local_15a0._8_8_;
          uStack_990 = local_15a0._16_8_;
          uStack_988 = local_15a0._24_8_;
          auVar3._16_8_ = uVar44;
          auVar3._0_16_ = auVar91;
          auVar3._24_8_ = uVar45;
          auVar4 = vpcmpgtq_avx2(auVar3,local_15a0);
          local_13c0 = 0;
          while( true ) {
            auVar3 = local_1780;
            uStack_1748 = auVar99._24_8_;
            uStack_1750 = auVar99._16_8_;
            if (local_135c + local_136c <= local_13c0) break;
            uVar39 = local_1780._0_8_;
            uVar41 = local_1780._24_8_;
            local_1180 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffe870),8);
            local_11a0 = vpsrldq_avx2(_local_17a0,8);
            auVar5 = vpor_avx2(local_1180,local_11a0);
            iStack_868 = local_13a8[local_13c0];
            local_1780._0_24_ = auVar5._0_24_;
            auVar40 = local_1780._0_24_;
            local_1780._24_8_ = iStack_868;
            auVar9 = local_1780;
            local_11c0 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffe7f0),8);
            local_11e0 = vpsrldq_avx2(_local_1820,8);
            auVar6 = vpor_avx2(local_11c0,local_11e0);
            iStack_8a8 = local_13b0[local_13c0];
            local_1780._0_8_ = auVar5._0_8_;
            local_1780._8_8_ = auVar5._8_8_;
            local_1780._16_8_ = auVar5._16_8_;
            local_880 = local_1780._0_8_;
            uStack_878 = local_1780._8_8_;
            uStack_870 = local_1780._16_8_;
            local_8a0 = local_14e0;
            uStack_898 = uStack_14d8;
            uStack_890 = uStack_14d0;
            uStack_888 = uStack_14c8;
            auVar17._24_8_ = iStack_868;
            auVar17._0_24_ = auVar40;
            auVar16._8_8_ = uStack_14d8;
            auVar16._0_8_ = local_14e0;
            auVar16._16_8_ = uStack_14d0;
            auVar16._24_8_ = uStack_14c8;
            auVar5 = vpsubq_avx2(auVar17,auVar16);
            local_1820._0_8_ = auVar6._0_8_;
            local_1820._8_8_ = auVar6._8_8_;
            local_1820._16_8_ = auVar6._16_8_;
            local_8c0 = local_1820._0_8_;
            uStack_8b8 = local_1820._8_8_;
            uStack_8b0 = local_1820._16_8_;
            local_8e0 = local_1500;
            uStack_8d8 = uStack_14f8;
            uStack_8d0 = uStack_14f0;
            uStack_8c8 = uStack_14e8;
            auVar15._24_8_ = iStack_8a8;
            auVar15._0_24_ = auVar6._0_24_;
            auVar6._8_8_ = uStack_14f8;
            auVar6._0_8_ = local_1500;
            auVar6._16_8_ = uStack_14f0;
            auVar6._24_8_ = uStack_14e8;
            auVar6 = vpsubq_avx2(auVar15,auVar6);
            local_1840 = auVar5._0_8_;
            uStack_1838 = auVar5._8_8_;
            uStack_1830 = auVar5._16_8_;
            uStack_1828 = auVar5._24_8_;
            a[0]._4_4_ = in_stack_ffffffffffffe4dc;
            a[0]._0_4_ = in_stack_ffffffffffffe4d8;
            a[1] = iVar80;
            a[2] = lVar78;
            a[3] = lVar79;
            b[0]._4_4_ = in_stack_ffffffffffffe4bc;
            b[0]._0_4_ = in_stack_ffffffffffffe4b8;
            b[1] = iVar83;
            b[2] = lVar134;
            b[3] = lVar82;
            uVar88 = local_1840;
            uVar100 = uStack_1838;
            uVar103 = uStack_1830;
            uVar106 = uStack_1828;
            _mm256_max_epi64_rpl(a,b);
            local_1820._8_8_ = uVar100;
            local_1820._0_8_ = uVar88;
            local_900 = local_17a0._0_8_;
            uStack_8f8 = local_17a0._8_8_;
            uStack_8f0 = local_17a0._16_8_;
            uStack_8e8 = lStack_1788;
            local_920 = local_14e0;
            uStack_918 = uStack_14d8;
            uStack_910 = uStack_14d0;
            uStack_908 = uStack_14c8;
            auVar7._8_8_ = uStack_14d8;
            auVar7._0_8_ = local_14e0;
            auVar7._16_8_ = uStack_14d0;
            auVar7._24_8_ = uStack_14c8;
            auVar7 = vpsubq_avx2(_local_17a0,auVar7);
            local_940 = local_17c0._0_8_;
            uStack_938 = local_17c0._8_8_;
            uStack_930 = local_17c0._16_8_;
            uStack_928 = local_17c0._24_8_;
            local_960 = local_1500;
            uStack_958 = uStack_14f8;
            uStack_950 = uStack_14f0;
            uStack_948 = uStack_14e8;
            auVar8._8_8_ = uStack_14f8;
            auVar8._0_8_ = local_1500;
            auVar8._16_8_ = uStack_14f0;
            auVar8._24_8_ = uStack_14e8;
            auVar8 = vpsubq_avx2(local_17c0,auVar8);
            local_17e0 = auVar7._0_8_;
            uStack_17d8 = auVar7._8_8_;
            uStack_17d0 = auVar7._16_8_;
            uStack_17c8 = auVar7._24_8_;
            a_00[0]._4_4_ = in_stack_ffffffffffffe4dc;
            a_00[0]._0_4_ = in_stack_ffffffffffffe4d8;
            a_00[1] = iVar80;
            a_00[2] = lVar78;
            a_00[3] = lVar79;
            b_00[0]._4_4_ = in_stack_ffffffffffffe4bc;
            b_00[0]._0_4_ = in_stack_ffffffffffffe4b8;
            b_00[1] = iVar83;
            b_00[2] = lVar134;
            b_00[3] = lVar82;
            uVar89 = local_17e0;
            uVar101 = uStack_17d8;
            uVar104 = uStack_17d0;
            uVar107 = uStack_17c8;
            _mm256_max_epi64_rpl(a_00,b_00);
            local_17c0._8_8_ = uVar101;
            local_17c0._0_8_ = uVar89;
            local_c28 = (ulong)*(int *)(lVar81 + local_13a0[local_13c0] * 4);
            local_c30 = (ulong)*(int *)(lVar84 + local_13a0[local_13c0 + -1] * 4);
            local_c38 = (ulong)*(int *)(lVar2 + lVar87 * 4 + local_13a0[local_13c0 + -2] * 4);
            local_c40 = (ulong)*(int *)(lVar1 + local_13a0[local_13c0 + -3] * 4);
            auVar98._8_8_ = 0;
            auVar98._0_8_ = local_c40;
            auVar123._8_8_ = 0;
            auVar123._0_8_ = local_c38;
            local_c60 = vpunpcklqdq_avx(auVar98,auVar123);
            auVar124._8_8_ = 0;
            auVar124._0_8_ = local_c30;
            auVar132._8_8_ = 0;
            auVar132._0_8_ = local_c28;
            auStack_c50 = vpunpcklqdq_avx(auVar124,auVar132);
            lStack_18f8 = auVar3._8_8_;
            lStack_18f0 = auVar3._16_8_;
            local_7c0 = uVar39;
            uStack_7b8 = lStack_18f8;
            uStack_7b0 = lStack_18f0;
            uStack_7a8 = uVar41;
            local_7e0 = local_c60._0_8_;
            uStack_7d8 = local_c60._8_8_;
            uStack_7d0 = auStack_c50._0_8_;
            uStack_7c8 = auStack_c50._8_8_;
            auVar19._16_8_ = auStack_c50._0_8_;
            auVar19._0_16_ = local_c60;
            auVar19._24_8_ = auStack_c50._8_8_;
            auVar3 = vpaddq_avx2(auVar3,auVar19);
            local_1900 = auVar3._0_8_;
            lStack_18f8 = auVar3._8_8_;
            lStack_18f0 = auVar3._16_8_;
            lStack_18e8 = auVar3._24_8_;
            a_01[0]._4_4_ = in_stack_ffffffffffffe4dc;
            a_01[0]._0_4_ = in_stack_ffffffffffffe4d8;
            a_01[1] = iVar80;
            a_01[2] = lVar78;
            a_01[3] = lVar79;
            b_01[0]._4_4_ = in_stack_ffffffffffffe4bc;
            b_01[0]._0_4_ = in_stack_ffffffffffffe4b8;
            b_01[1] = iVar83;
            b_01[2] = lVar134;
            b_01[3] = lVar82;
            _mm256_max_epi64_rpl(a_01,b_01);
            a_02[0]._4_4_ = in_stack_ffffffffffffe4dc;
            a_02[0]._0_4_ = in_stack_ffffffffffffe4d8;
            a_02[1] = iVar80;
            a_02[2] = lVar78;
            a_02[3] = lVar79;
            b_02[0]._4_4_ = in_stack_ffffffffffffe4bc;
            b_02[0]._0_4_ = in_stack_ffffffffffffe4b8;
            b_02[1] = iVar83;
            b_02[2] = lVar134;
            b_02[3] = lVar82;
            uVar90 = local_1900;
            lVar102 = lStack_18f8;
            lVar105 = lStack_18f0;
            lVar108 = lStack_18e8;
            _mm256_max_epi64_rpl(a_02,b_02);
            a_03[0]._4_4_ = in_stack_ffffffffffffe4dc;
            a_03[0]._0_4_ = in_stack_ffffffffffffe4d8;
            a_03[1] = iVar80;
            a_03[2] = lVar78;
            a_03[3] = lVar79;
            b_03[0]._4_4_ = in_stack_ffffffffffffe4bc;
            b_03[0]._0_4_ = in_stack_ffffffffffffe4b8;
            b_03[1] = iVar83;
            b_03[2] = lVar134;
            b_03[3] = lVar82;
            _mm256_max_epi64_rpl(a_03,b_03);
            local_17a0._8_8_ = lVar102;
            local_17a0._0_8_ = uVar90;
            local_680 = local_1880._0_8_;
            lStack_678 = local_1880._8_8_;
            lStack_670 = local_1880._16_8_;
            lStack_668 = local_1880._24_8_;
            local_6a0 = local_1580;
            lStack_698 = lStack_1578;
            lStack_690 = lStack_1570;
            lStack_688 = lStack_1568;
            local_260 = -(ulong)(local_1880._0_8_ == local_1580);
            lStack_258 = -(ulong)(local_1880._8_8_ == lStack_1578);
            lStack_250 = -(ulong)(local_1880._16_8_ == lStack_1570);
            lStack_248 = -(ulong)(local_1880._24_8_ == lStack_1568);
            local_640._8_8_ = lStack_258;
            local_640._0_8_ = local_260;
            local_640._16_8_ = lStack_250;
            local_640._24_8_ = lStack_248;
            auVar3 = vpcmpeqd_avx2(local_640,local_640);
            auVar20._16_8_ = lVar105;
            auVar20._0_16_ = local_17a0._0_16_;
            auVar20._24_8_ = lVar108;
            _local_17a0 = vpand_avx2(local_640 ^ auVar3,auVar20);
            local_1e0 = local_14a0;
            uStack_1d8 = uStack_1498;
            uStack_1d0 = uStack_1490;
            uStack_1c8 = uStack_1488;
            auVar37._16_8_ = uVar103;
            auVar37._0_16_ = local_1820._0_16_;
            auVar37._24_8_ = uVar106;
            auVar36._8_8_ = uStack_1498;
            auVar36._0_8_ = local_14a0;
            auVar36._16_8_ = uStack_1490;
            auVar36._24_8_ = uStack_1488;
            auVar35._8_8_ = lStack_258;
            auVar35._0_8_ = local_260;
            auVar35._16_8_ = lStack_250;
            auVar35._24_8_ = lStack_248;
            _local_1820 = vpblendvb_avx2(auVar37,auVar36,auVar35);
            local_240 = local_14a0;
            uStack_238 = uStack_1498;
            uStack_230 = uStack_1490;
            uStack_228 = uStack_1488;
            auVar34._16_8_ = uVar104;
            auVar34._0_16_ = local_17c0._0_16_;
            auVar34._24_8_ = uVar107;
            auVar33._8_8_ = uStack_1498;
            auVar33._0_8_ = local_14a0;
            auVar33._16_8_ = uStack_1490;
            auVar33._24_8_ = uStack_1488;
            auVar32._8_8_ = lStack_258;
            auVar32._0_8_ = local_260;
            auVar32._16_8_ = lStack_250;
            auVar32._24_8_ = lStack_248;
            local_17c0 = vpblendvb_avx2(auVar34,auVar33,auVar32);
            local_660 = uVar90;
            lStack_658 = lVar102;
            lStack_650 = lVar105;
            lStack_648 = lVar108;
            local_220 = uVar89;
            uStack_218 = uVar101;
            uStack_210 = uVar104;
            uStack_208 = uVar107;
            local_200 = local_260;
            lStack_1f8 = lStack_258;
            lStack_1f0 = lStack_250;
            lStack_1e8 = lStack_248;
            local_1c0 = uVar88;
            uStack_1b8 = uVar100;
            uStack_1b0 = uVar103;
            uStack_1a8 = uVar106;
            if (local_136c < local_13c0) {
              a_04[0]._4_4_ = in_stack_ffffffffffffe4dc;
              a_04[0]._0_4_ = in_stack_ffffffffffffe4d8;
              a_04[1] = iVar80;
              a_04[2] = lVar78;
              a_04[3] = lVar79;
              b_04[0]._4_4_ = in_stack_ffffffffffffe4bc;
              b_04[0]._0_4_ = in_stack_ffffffffffffe4b8;
              b_04[1] = iVar83;
              b_04[2] = lVar134;
              b_04[3] = lVar82;
              _mm256_min_epi64_rpl(a_04,b_04);
              a_05[0]._4_4_ = in_stack_ffffffffffffe4dc;
              a_05[0]._0_4_ = in_stack_ffffffffffffe4d8;
              a_05[1] = iVar80;
              a_05[2] = lVar78;
              a_05[3] = lVar79;
              b_05[0]._4_4_ = in_stack_ffffffffffffe4bc;
              b_05[0]._0_4_ = in_stack_ffffffffffffe4b8;
              b_05[1] = iVar83;
              b_05[2] = lVar134;
              b_05[3] = lVar82;
              _mm256_max_epi64_rpl(a_05,b_05);
            }
            local_6c0 = local_17a0._0_8_;
            lStack_6b8 = local_17a0._8_8_;
            lStack_6b0 = local_17a0._16_8_;
            lStack_6a8 = lStack_1788;
            local_6e0 = local_1520;
            lStack_6d8 = lStack_1518;
            lStack_6d0 = lStack_1510;
            lStack_6c8 = lStack_1508;
            local_320 = -(ulong)(local_17a0._0_8_ == local_1520);
            lStack_318 = -(ulong)(local_17a0._8_8_ == lStack_1518);
            lStack_310 = -(ulong)(local_17a0._16_8_ == lStack_1510);
            lStack_308 = -(ulong)(lStack_1788 == lStack_1508);
            local_700 = local_17a0._0_8_;
            lStack_6f8 = local_17a0._8_8_;
            lStack_6f0 = local_17a0._16_8_;
            lStack_6e8 = lStack_1788;
            local_380 = -(ulong)(local_17a0._0_8_ == local_1900);
            lStack_378 = -(ulong)(local_17a0._8_8_ == lStack_18f8);
            lStack_370 = -(ulong)(local_17a0._16_8_ == lStack_18f0);
            lStack_368 = -(ulong)(lStack_1788 == lStack_18e8);
            local_740 = local_17a0._0_8_;
            lStack_738 = local_17a0._8_8_;
            lStack_730 = local_17a0._16_8_;
            lStack_728 = lStack_1788;
            local_760 = local_1820._0_8_;
            lStack_758 = local_1820._8_8_;
            lStack_750 = local_1820._16_8_;
            lStack_748 = lStack_1808;
            local_2c0 = -(ulong)(local_17a0._0_8_ == local_1820._0_8_);
            lStack_2b8 = -(ulong)(local_17a0._8_8_ == local_1820._8_8_);
            lStack_2b0 = -(ulong)(local_17a0._16_8_ == local_1820._16_8_);
            lStack_2a8 = -(ulong)(lStack_1788 == lStack_1808);
            local_280 = uVar54;
            uStack_278 = uVar55;
            uStack_270 = uVar56;
            uStack_268 = uVar57;
            local_2a0 = uVar58;
            uStack_298 = uVar59;
            uStack_290 = uVar60;
            uStack_288 = uVar61;
            auVar31._16_8_ = uVar56;
            auVar31._0_16_ = auVar94;
            auVar31._24_8_ = uVar57;
            auVar30._16_8_ = uVar60;
            auVar30._0_16_ = auVar95;
            auVar30._24_8_ = uVar61;
            auVar29._8_8_ = lStack_2b8;
            auVar29._0_8_ = local_2c0;
            auVar29._16_8_ = lStack_2b0;
            auVar29._24_8_ = lStack_2a8;
            local_340 = vpblendvb_avx2(auVar31,auVar30,auVar29);
            local_2e0 = uVar50;
            uStack_2d8 = uVar51;
            uStack_2d0 = uVar52;
            uStack_2c8 = uVar53;
            local_300 = uVar62;
            uStack_2f8 = uVar63;
            uStack_2f0 = uVar64;
            uStack_2e8 = uVar65;
            auVar28._16_8_ = uVar52;
            auVar28._0_16_ = auVar93;
            auVar28._24_8_ = uVar53;
            auVar27._16_8_ = uVar64;
            auVar27._0_16_ = auVar96;
            auVar27._24_8_ = uVar65;
            auVar26._8_8_ = lStack_318;
            auVar26._0_8_ = local_320;
            auVar26._16_8_ = lStack_310;
            auVar26._24_8_ = lStack_308;
            local_360 = vpblendvb_avx2(auVar28,auVar27,auVar26);
            auVar25._8_8_ = lStack_378;
            auVar25._0_8_ = local_380;
            auVar25._16_8_ = lStack_370;
            auVar25._24_8_ = lStack_368;
            auVar3 = vpblendvb_avx2(local_340,local_360,auVar25);
            local_1800 = auVar8._0_8_;
            uStack_17f8 = auVar8._8_8_;
            uStack_17f0 = auVar8._16_8_;
            uStack_17e8 = auVar8._24_8_;
            local_9c0 = local_17e0;
            uStack_9b8 = uStack_17d8;
            uStack_9b0 = uStack_17d0;
            uStack_9a8 = uStack_17c8;
            local_9e0 = local_1800;
            uStack_9d8 = uStack_17f8;
            uStack_9d0 = uStack_17f0;
            uStack_9c8 = uStack_17e8;
            auVar7 = vpcmpgtq_avx2(auVar7,auVar8);
            local_1860 = auVar6._0_8_;
            uStack_1858 = auVar6._8_8_;
            uStack_1850 = auVar6._16_8_;
            uStack_1848 = auVar6._24_8_;
            local_a00 = local_1840;
            uStack_9f8 = uStack_1838;
            uStack_9f0 = uStack_1830;
            uStack_9e8 = uStack_1828;
            local_a20 = local_1860;
            uStack_a18 = uStack_1858;
            uStack_a10 = uStack_1850;
            uStack_a08 = uStack_1848;
            auVar6 = vpcmpgtq_avx2(auVar5,auVar6);
            local_19c0 = auVar7._0_8_;
            uStack_19b8 = auVar7._8_8_;
            uStack_19b0 = auVar7._16_8_;
            uStack_19a8 = auVar7._24_8_;
            local_3a0 = uVar70;
            uStack_398 = uVar71;
            uStack_390 = uVar72;
            uStack_388 = uVar73;
            local_3c0 = uVar66;
            uStack_3b8 = uVar67;
            uStack_3b0 = uVar68;
            uStack_3a8 = uVar69;
            local_3e0 = local_19c0;
            uStack_3d8 = uStack_19b8;
            uStack_3d0 = uStack_19b0;
            uStack_3c8 = uStack_19a8;
            auVar24._16_8_ = uVar72;
            auVar24._0_16_ = auVar109;
            auVar24._24_8_ = uVar73;
            auVar23._16_8_ = uVar68;
            auVar23._0_16_ = auVar97;
            auVar23._24_8_ = uVar69;
            auVar5 = vpblendvb_avx2(auVar24,auVar23,auVar7);
            local_19e0 = auVar6._0_8_;
            uStack_19d8 = auVar6._8_8_;
            uStack_19d0 = auVar6._16_8_;
            uStack_19c8 = auVar6._24_8_;
            local_420 = uVar74;
            uStack_418 = uVar75;
            uStack_410 = uVar76;
            uStack_408 = uVar77;
            local_440 = local_19e0;
            uStack_438 = uStack_19d8;
            uStack_430 = uStack_19d0;
            uStack_428 = uStack_19c8;
            auVar22._16_8_ = uStack_1750;
            auVar22._0_16_ = auVar99._0_16_;
            auVar22._24_8_ = uStack_1748;
            auVar21._16_8_ = uVar76;
            auVar21._0_16_ = auVar110;
            auVar21._24_8_ = uVar77;
            auVar6 = vpblendvb_avx2(auVar22,auVar21,auVar6);
            local_19a0 = auVar3._0_8_;
            uStack_1998 = auVar3._8_8_;
            uStack_1990 = auVar3._16_8_;
            uStack_1988 = auVar3._24_8_;
            local_1a00 = auVar5._0_8_;
            uStack_19f8 = auVar5._8_8_;
            uStack_19f0 = auVar5._16_8_;
            uStack_19e8 = auVar5._24_8_;
            local_1200 = local_19a0;
            uStack_11f8 = uStack_1998;
            uStack_11f0 = uStack_1990;
            uStack_11e8 = uStack_1988;
            local_1220 = local_1a00;
            uStack_1218 = uStack_19f8;
            uStack_1210 = uStack_19f0;
            uStack_1208 = uStack_19e8;
            auVar3 = vpor_avx2(auVar3,auVar5);
            local_19a0 = auVar3._0_8_;
            uStack_1998 = auVar3._8_8_;
            uStack_1990 = auVar3._16_8_;
            uStack_1988 = auVar3._24_8_;
            local_1a20 = auVar6._0_8_;
            uStack_1a18 = auVar6._8_8_;
            uStack_1a10 = auVar6._16_8_;
            uStack_1a08 = auVar6._24_8_;
            local_1240 = local_19a0;
            uStack_1238 = uStack_1998;
            uStack_1230 = uStack_1990;
            uStack_1228 = uStack_1988;
            local_1260 = local_1a20;
            uStack_1258 = uStack_1a18;
            uStack_1250 = uStack_1a10;
            uStack_1248 = uStack_1a08;
            vpor_avx2(auVar3,auVar6);
            vWH_00[0]._4_4_ = in_stack_ffffffffffffe47c;
            vWH_00[0]._0_4_ = in_stack_ffffffffffffe478;
            vWH_00[1] = iVar86;
            vWH_00[2] = lVar133;
            vWH_00[3] = lVar85;
            local_720 = local_1900;
            lStack_718 = lStack_18f8;
            lStack_710 = lStack_18f0;
            lStack_708 = lStack_18e8;
            local_400 = auVar99._0_16_;
            auStack_3f0 = auVar99._16_16_;
            arr_store_si256(array,vWH_00,in_stack_ffffffffffffe474,in_stack_ffffffffffffe470,
                            in_stack_ffffffffffffe46c,in_stack_ffffffffffffe468);
            local_13a8[local_13c0 + -3] = local_17a0._0_8_;
            local_13b0[local_13c0 + -3] = local_1820._0_8_;
            local_a40 = local_1880._0_8_;
            lStack_a38 = local_1880._8_8_;
            lStack_a30 = local_1880._16_8_;
            lStack_a28 = local_1880._24_8_;
            local_a60 = local_1580;
            lStack_a58 = lStack_1578;
            lStack_a50 = lStack_1570;
            lStack_a48 = lStack_1568;
            auVar14._8_8_ = lStack_1578;
            auVar14._0_8_ = local_1580;
            auVar14._16_8_ = lStack_1570;
            auVar14._24_8_ = lStack_1568;
            local_80 = vpcmpgtq_avx2(local_1880,auVar14);
            local_a80 = uVar46;
            uStack_a78 = uVar47;
            uStack_a70 = uVar48;
            uStack_a68 = uVar49;
            local_aa0 = local_1880._0_8_;
            lStack_a98 = local_1880._8_8_;
            lStack_a90 = local_1880._16_8_;
            lStack_a88 = local_1880._24_8_;
            auVar13._16_8_ = uVar48;
            auVar13._0_16_ = auVar92;
            auVar13._24_8_ = uVar49;
            local_a0 = vpcmpgtq_avx2(auVar13,local_1880);
            auVar3 = vpand_avx2(local_80,local_a0);
            local_1a40 = auVar3._0_8_;
            local_c0 = local_1a40;
            uStack_1a38 = auVar3._8_8_;
            uStack_b8 = uStack_1a38;
            uStack_1a30 = auVar3._16_8_;
            uStack_b0 = uStack_1a30;
            uStack_1a28 = auVar3._24_8_;
            uStack_a8 = uStack_1a28;
            local_18c0 = auVar4._0_8_;
            local_e0 = local_18c0;
            uStack_18b8 = auVar4._8_8_;
            uStack_d8 = uStack_18b8;
            uStack_18b0 = auVar4._16_8_;
            uStack_d0 = uStack_18b0;
            uStack_18a8 = auVar4._24_8_;
            uStack_c8 = uStack_18a8;
            auVar3 = vpand_avx2(auVar3,auVar4);
            local_780 = local_17a0._0_8_;
            lStack_778 = local_17a0._8_8_;
            lStack_770 = local_17a0._16_8_;
            lStack_768 = lStack_1788;
            local_7a0 = local_15e0._0_8_;
            lStack_798 = local_15e0._8_8_;
            lStack_790 = local_15e0._16_8_;
            lStack_788 = local_15e0._24_8_;
            local_160 = -(ulong)(local_17a0._0_8_ == local_15e0._0_8_);
            lStack_158 = -(ulong)(local_17a0._8_8_ == local_15e0._8_8_);
            lStack_150 = -(ulong)(local_17a0._16_8_ == local_15e0._16_8_);
            lStack_148 = -(ulong)(lStack_1788 == local_15e0._24_8_);
            local_ac0 = local_17a0._0_8_;
            lStack_ab8 = local_17a0._8_8_;
            lStack_ab0 = local_17a0._16_8_;
            lStack_aa8 = lStack_1788;
            local_ae0 = local_15e0._0_8_;
            lStack_ad8 = local_15e0._8_8_;
            lStack_ad0 = local_15e0._16_8_;
            lStack_ac8 = local_15e0._24_8_;
            auVar5 = vpcmpgtq_avx2(_local_17a0,local_15e0);
            local_1aa0 = auVar5._0_8_;
            local_100 = local_1aa0;
            uStack_1a98 = auVar5._8_8_;
            uStack_f8 = uStack_1a98;
            uStack_1a90 = auVar5._16_8_;
            uStack_f0 = uStack_1a90;
            uStack_1a88 = auVar5._24_8_;
            uStack_e8 = uStack_1a88;
            local_1a60 = auVar3._0_8_;
            local_120 = local_1a60;
            uStack_1a58 = auVar3._8_8_;
            uStack_118 = uStack_1a58;
            uStack_1a50 = auVar3._16_8_;
            uStack_110 = uStack_1a50;
            uStack_1a48 = auVar3._24_8_;
            uStack_108 = uStack_1a48;
            auVar5 = vpand_avx2(auVar5,auVar3);
            local_b00 = local_1620._0_8_;
            uStack_af8 = local_1620._8_8_;
            uStack_af0 = local_1620._16_8_;
            uStack_ae8 = local_1620._24_8_;
            local_b20 = local_1880._0_8_;
            lStack_b18 = local_1880._8_8_;
            lStack_b10 = local_1880._16_8_;
            lStack_b08 = local_1880._24_8_;
            auVar8 = vpcmpgtq_avx2(local_1620,local_1880);
            local_460 = local_15e0._0_8_;
            lStack_458 = local_15e0._8_8_;
            lStack_450 = local_15e0._16_8_;
            lStack_448 = local_15e0._24_8_;
            local_480 = local_17a0._0_8_;
            lStack_478 = local_17a0._8_8_;
            lStack_470 = local_17a0._16_8_;
            lStack_468 = lStack_1788;
            local_1ac0 = auVar5._0_8_;
            local_4a0 = local_1ac0;
            uStack_1ab8 = auVar5._8_8_;
            uStack_498 = uStack_1ab8;
            uStack_1ab0 = auVar5._16_8_;
            uStack_490 = uStack_1ab0;
            uStack_1aa8 = auVar5._24_8_;
            uStack_488 = uStack_1aa8;
            local_15e0 = vpblendvb_avx2(local_15e0,_local_17a0,auVar5);
            local_4c0 = local_1600._0_8_;
            uStack_4b8 = local_1600._8_8_;
            uStack_4b0 = local_1600._16_8_;
            uStack_4a8 = local_1600._24_8_;
            local_4e0 = local_15a0._0_8_;
            uStack_4d8 = local_15a0._8_8_;
            uStack_4d0 = local_15a0._16_8_;
            uStack_4c8 = local_15a0._24_8_;
            local_500 = local_1ac0;
            uStack_4f8 = uStack_1ab8;
            uStack_4f0 = uStack_1ab0;
            uStack_4e8 = uStack_1aa8;
            auVar6 = vpblendvb_avx2(local_1600,local_15a0,auVar5);
            local_520 = local_1620._0_8_;
            uStack_518 = local_1620._8_8_;
            uStack_510 = local_1620._16_8_;
            uStack_508 = local_1620._24_8_;
            local_540 = local_1880._0_8_;
            lStack_538 = local_1880._8_8_;
            lStack_530 = local_1880._16_8_;
            lStack_528 = local_1880._24_8_;
            local_560 = local_1ac0;
            uStack_558 = uStack_1ab8;
            uStack_550 = uStack_1ab0;
            uStack_548 = uStack_1aa8;
            auVar7 = vpblendvb_avx2(local_1620,local_1880,auVar5);
            local_1ae0 = auVar8._0_8_;
            local_140 = local_1ae0;
            uStack_1ad8 = auVar8._8_8_;
            uStack_138 = uStack_1ad8;
            uStack_1ad0 = auVar8._16_8_;
            uStack_130 = uStack_1ad0;
            uStack_1ac8 = auVar8._24_8_;
            uStack_128 = uStack_1ac8;
            auVar38._8_8_ = lStack_158;
            auVar38._0_8_ = local_160;
            auVar38._16_8_ = lStack_150;
            auVar38._24_8_ = lStack_148;
            auVar5 = vpand_avx2(auVar8,auVar38);
            local_1ac0 = auVar5._0_8_;
            local_180 = local_1ac0;
            uStack_1ab8 = auVar5._8_8_;
            uStack_178 = uStack_1ab8;
            uStack_1ab0 = auVar5._16_8_;
            uStack_170 = uStack_1ab0;
            uStack_1aa8 = auVar5._24_8_;
            uStack_168 = uStack_1aa8;
            local_1a0 = local_1a60;
            uStack_198 = uStack_1a58;
            uStack_190 = uStack_1a50;
            uStack_188 = uStack_1a48;
            auVar3 = vpand_avx2(auVar5,auVar3);
            local_1600._0_8_ = auVar6._0_8_;
            local_580 = local_1600._0_8_;
            local_1600._8_8_ = auVar6._8_8_;
            uStack_578 = local_1600._8_8_;
            local_1600._16_8_ = auVar6._16_8_;
            uStack_570 = local_1600._16_8_;
            local_1600._24_8_ = auVar6._24_8_;
            uStack_568 = local_1600._24_8_;
            local_5a0 = local_15a0._0_8_;
            uStack_598 = local_15a0._8_8_;
            uStack_590 = local_15a0._16_8_;
            uStack_588 = local_15a0._24_8_;
            local_1ac0 = auVar3._0_8_;
            local_5c0 = local_1ac0;
            uStack_1ab8 = auVar3._8_8_;
            uStack_5b8 = uStack_1ab8;
            uStack_1ab0 = auVar3._16_8_;
            uStack_5b0 = uStack_1ab0;
            uStack_1aa8 = auVar3._24_8_;
            uStack_5a8 = uStack_1aa8;
            local_1600 = vpblendvb_avx2(auVar6,local_15a0,auVar3);
            local_1620._0_8_ = auVar7._0_8_;
            local_5e0 = local_1620._0_8_;
            local_1620._8_8_ = auVar7._8_8_;
            uStack_5d8 = local_1620._8_8_;
            local_1620._16_8_ = auVar7._16_8_;
            uStack_5d0 = local_1620._16_8_;
            local_1620._24_8_ = auVar7._24_8_;
            uStack_5c8 = local_1620._24_8_;
            local_600 = local_1880._0_8_;
            lStack_5f8 = local_1880._8_8_;
            lStack_5f0 = local_1880._16_8_;
            lStack_5e8 = local_1880._24_8_;
            local_620 = local_1ac0;
            uStack_618 = uStack_1ab8;
            uStack_610 = uStack_1ab0;
            uStack_608 = uStack_1aa8;
            local_1620 = vpblendvb_avx2(auVar7,local_1880,auVar3);
            local_800 = local_1880._0_8_;
            lStack_7f8 = local_1880._8_8_;
            lStack_7f0 = local_1880._16_8_;
            lStack_7e8 = local_1880._24_8_;
            local_820 = local_1540;
            uStack_818 = uStack_1538;
            uStack_810 = uStack_1530;
            uStack_808 = uStack_1528;
            auVar18._8_8_ = uStack_1538;
            auVar18._0_8_ = local_1540;
            auVar18._16_8_ = uStack_1530;
            auVar18._24_8_ = uStack_1528;
            local_1880 = vpaddq_avx2(local_1880,auVar18);
            local_13c0 = local_13c0 + 1;
            local_1780 = auVar9;
          }
          local_840 = local_15a0._0_8_;
          uStack_838 = local_15a0._8_8_;
          uStack_830 = local_15a0._16_8_;
          uStack_828 = local_15a0._24_8_;
          local_860 = local_1560;
          uStack_858 = uStack_1558;
          uStack_850 = uStack_1550;
          uStack_848 = uStack_1548;
          auVar5._8_8_ = uStack_1558;
          auVar5._0_8_ = local_1560;
          auVar5._16_8_ = uStack_1550;
          auVar5._24_8_ = uStack_1548;
          local_15a0 = vpaddq_avx2(local_15a0,auVar5);
        }
        local_1ae8 = (ulong *)local_15e0;
        local_1af0 = (long *)local_1600;
        local_1af8 = (long *)local_1620;
        for (local_1afc = 0; local_1afc < local_1368; local_1afc = local_1afc + 1) {
          if ((long)local_13e8 < (long)*local_1ae8) {
            local_13e8 = *local_1ae8;
            local_13c8 = (int)*local_1af0;
            local_13cc = (int)*local_1af8;
          }
          else if (*local_1ae8 == local_13e8) {
            if (*local_1af8 < (long)local_13cc) {
              local_13c8 = (int)*local_1af0;
              local_13cc = (int)*local_1af8;
            }
            else if ((*local_1af8 == (long)local_13cc) && (*local_1af0 < (long)local_13c8)) {
              local_13c8 = (int)*local_1af0;
              local_13cc = (int)*local_1af8;
            }
          }
          local_1ae8 = local_1ae8 + 1;
          local_1af0 = local_1af0 + 1;
          local_1af8 = local_1af8 + 1;
        }
        local_b40 = local_1420;
        uStack_b38 = uStack_1418;
        uStack_b30 = uStack_1410;
        uStack_b28 = uStack_1408;
        local_b60 = local_1460;
        uStack_b58 = uStack_1458;
        uStack_b50 = uStack_1450;
        uStack_b48 = uStack_1448;
        auVar12._8_8_ = uStack_1418;
        auVar12._0_8_ = local_1420;
        auVar12._16_8_ = uStack_1410;
        auVar12._24_8_ = uStack_1408;
        auVar11._8_8_ = uStack_1458;
        auVar11._0_8_ = local_1460;
        auVar11._16_8_ = uStack_1450;
        auVar11._24_8_ = uStack_1448;
        local_1280 = vpcmpgtq_avx2(auVar12,auVar11);
        local_b80 = local_1480;
        uStack_b78 = uStack_1478;
        uStack_b70 = uStack_1470;
        uStack_b68 = uStack_1468;
        local_ba0 = local_1440;
        uStack_b98 = uStack_1438;
        uStack_b90 = uStack_1430;
        uStack_b88 = uStack_1428;
        auVar10._8_8_ = uStack_1478;
        auVar10._0_8_ = local_1480;
        auVar10._16_8_ = uStack_1470;
        auVar10._24_8_ = uStack_1468;
        auVar9._8_8_ = uStack_1438;
        auVar9._0_8_ = local_1440;
        auVar9._16_8_ = uStack_1430;
        auVar9._24_8_ = uStack_1428;
        local_12a0 = vpcmpgtq_avx2(auVar10,auVar9);
        local_60 = vpor_avx2(local_1280,local_12a0);
        if ((((((((((((((((((((((((((((((((local_60 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_60 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_60 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_60 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_60 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_60 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_60 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_60 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_60 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_60 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (local_60 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                               (local_60 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (local_60 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                              ) || (local_60 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                            (local_60 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(local_60 >> 0x7f,0) != '\0') ||
                          (local_60 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_60 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_60 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_60 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_60 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_60 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_60 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_60 >> 0xbf,0) != '\0') ||
                  (local_60 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_60 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_60 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_60 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_60 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_60 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_60 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_60[0x1f] < '\0') {
          local_13b8->flag = local_13b8->flag | 0x40;
          local_13e8 = 0;
          local_13c8 = 0;
          local_13cc = 0;
        }
        local_13b8->score = (int)local_13e8;
        local_13b8->end_query = local_13c8;
        local_13b8->end_ref = local_13cc;
        parasail_free(local_1398);
        parasail_free(local_1390);
        parasail_free(local_1388);
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          parasail_free(local_1380);
        }
        local_1340 = local_13b8;
      }
    }
  }
  return local_1340;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;
    __m256i vTDiag;
    __m256i vTIns;
    __m256i vTDel;
    __m256i vTZero;
    __m256i vTDiagE;
    __m256i vTInsE;
    __m256i vTDiagF;
    __m256i vTDelF;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }
        
    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm256_set1_epi64x_rpl(open);
    vGap  = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_set1_epi64x_rpl(0);
    vOne = _mm256_set1_epi64x_rpl(1);
    vN = _mm256_set1_epi64x_rpl(N);
    vNegOne = _mm256_set1_epi64x_rpl(-1);
    vI = _mm256_set_epi64x_rpl(0,1,2,3);
    vJreset = _mm256_set_epi64x_rpl(0,-1,-2,-3);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi64x_rpl(s1Len);
    vJLimit = _mm256_set1_epi64x_rpl(s2Len);
    vTDiag = _mm256_set1_epi64x_rpl(PARASAIL_DIAG);
    vTIns = _mm256_set1_epi64x_rpl(PARASAIL_INS);
    vTDel = _mm256_set1_epi64x_rpl(PARASAIL_DEL);
    vTZero = _mm256_set1_epi64x_rpl(PARASAIL_ZERO);
    vTDiagE = _mm256_set1_epi64x_rpl(PARASAIL_DIAG_E);
    vTInsE = _mm256_set1_epi64x_rpl(PARASAIL_INS_E);
    vTDiagF = _mm256_set1_epi64x_rpl(PARASAIL_DIAG_F);
    vTDelF = _mm256_set1_epi64x_rpl(PARASAIL_DEL_F);

    /* initialize result */
    result = parasail_result_new_trace(s1Len, s2Len, 32, sizeof(int8_t));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vE_opn = vNegInf;
        __m256i vE_ext = vNegInf;
        __m256i vF = vNegInf;
        __m256i vF_opn = vNegInf;
        __m256i vF_ext = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m256i vIltLimit = _mm256_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 8);
            vNH = _mm256_insert_epi64_rpl(vNH, H_pr[j], 3);
            vF = _mm256_srli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, F_pr[j], 3);
            vF_opn = _mm256_sub_epi64(vNH, vOpen);
            vF_ext = _mm256_sub_epi64(vF, vGap);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            vE_opn = _mm256_sub_epi64(vWH, vOpen);
            vE_ext = _mm256_sub_epi64(vE, vGap);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            vMat = _mm256_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm256_add_epi64(vNWH, vMat);
            vNWH = _mm256_max_epi64_rpl(vNWH, vZero);
            vWH = _mm256_max_epi64_rpl(vNWH, vE);
            vWH = _mm256_max_epi64_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
            /* trace table */
            {
                __m256i cond_zero = _mm256_cmpeq_epi64(vWH, vZero);
                __m256i case1 = _mm256_cmpeq_epi64(vWH, vNWH);
                __m256i case2 = _mm256_cmpeq_epi64(vWH, vF);
                __m256i vT = _mm256_blendv_epi8(
                        _mm256_blendv_epi8(vTIns, vTDel, case2),
                        _mm256_blendv_epi8(vTDiag, vTZero, cond_zero),
                        case1);
                __m256i condE = _mm256_cmpgt_epi64(vE_opn, vE_ext);
                __m256i condF = _mm256_cmpgt_epi64(vF_opn, vF_ext);
                __m256i vET = _mm256_blendv_epi8(vTInsE, vTDiagE, condE);
                __m256i vFT = _mm256_blendv_epi8(vTDelF, vTDiagF, condF);
                vT = _mm256_or_si256(vT, vET);
                vT = _mm256_or_si256(vT, vFT);
                arr_store_si256(result->trace->trace_table, vT, i, s1Len, j, s2Len);
            }
            H_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWH,0);
            F_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi64(vJ, vNegOne),
                        _mm256_cmplt_epi64_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi64(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi64(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_add_epi64(vJ, vOne);
        }
        vI = _mm256_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}